

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O0

int __thiscall AggressiveBotStrategy::intInput(AggressiveBotStrategy *this,StrategyContext context)

{
  void *this_00;
  int local_18;
  int count;
  StrategyContext context_local;
  AggressiveBotStrategy *this_local;
  
  switch(context) {
  case ATTACK_FROM_COUNTRY:
    local_18 = attackFromCountryIndex(this);
    break;
  case ATTACK_TO_COUNTRY:
    local_18 = attackToCountryIndex(this);
    break;
  case ATTACK_DICE_COUNT:
    local_18 = attackNumDice(this);
    break;
  case ATTACK_NEW_ARMY_COUNT:
    local_18 = 1;
    break;
  case DEFEND_DICE_COUNT:
    local_18 = defendNumDice(this);
    break;
  default:
    local_18 = -1;
    break;
  case FORTIFY_FROM_COUNTRY:
    local_18 = fortifyFromCountryIndex(this);
    break;
  case FORTIFY_TO_COUNTRY:
    local_18 = fortifyToCountryIndex(this);
    break;
  case FORTIFY_ARMY_COUNT:
    local_18 = fortifyArmyCount(this);
    break;
  case REINFORCE_CARD_COUNT:
    local_18 = numCards(this);
    break;
  case REINFORCE_ARMY_COUNT:
    local_18 = reinforceArmyCount(this);
  }
  this_00 = (void *)std::ostream::operator<<(&std::cout,local_18);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return local_18;
}

Assistant:

int AggressiveBotStrategy::intInput(StrategyContext context) {
    int count = 0;

    switch ((int) context) {
        case StrategyContext::ATTACK_FROM_COUNTRY:
            count = attackFromCountryIndex();
            break;
        case StrategyContext::ATTACK_TO_COUNTRY:
            count = attackToCountryIndex();
            break;
        case StrategyContext::ATTACK_DICE_COUNT:
            count = attackNumDice();
            break;
        case StrategyContext::ATTACK_NEW_ARMY_COUNT:
            count = 1;
            break;
        case StrategyContext::DEFEND_DICE_COUNT:
            count = defendNumDice();
            break;
        case StrategyContext::FORTIFY_FROM_COUNTRY:
            count = fortifyFromCountryIndex();
            break;
        case StrategyContext::FORTIFY_TO_COUNTRY:
            count = fortifyToCountryIndex();
            break;
        case StrategyContext::FORTIFY_ARMY_COUNT:
            count = fortifyArmyCount();
            break;
        case StrategyContext::REINFORCE_ARMY_COUNT:
            count = reinforceArmyCount();
            break;
        case StrategyContext::REINFORCE_CARD_COUNT:
            count = numCards();
            break;
        default: {
            count = -1;
        }
    }
    std::cout << count << std::endl;
    return count;
}